

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_buffer_encode(aec_stream *strm)

{
  int status;
  aec_stream *strm_local;
  
  strm_local._4_4_ = aec_encode_init(strm);
  if (strm_local._4_4_ == 0) {
    strm_local._4_4_ = aec_encode(strm,1);
    if (strm_local._4_4_ == 0) {
      strm_local._4_4_ = aec_encode_end(strm);
    }
    else {
      cleanup((EVP_PKEY_CTX *)strm);
    }
  }
  return strm_local._4_4_;
}

Assistant:

int aec_buffer_encode(struct aec_stream *strm)
{
    int status = aec_encode_init(strm);
    if (status != AEC_OK)
        return status;
    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        cleanup(strm);
        return status;
    }
    return aec_encode_end(strm);
}